

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  undefined4 uVar4;
  
  pvVar1 = a->format_data;
  if ((long)*(ulong *)((long)pvVar1 + 0x28) < (long)s) {
    s = *(ulong *)((long)pvVar1 + 0x28);
  }
  *(long *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) + s;
  if (s == 0) {
    return 0;
  }
  if (*(int *)((long)pvVar1 + 0x3c) == 8) {
    *(void **)((long)pvVar1 + 0xb0) = buff;
    *(int *)((long)pvVar1 + 0xb8) = (int)s;
    do {
      iVar3 = cm_zlib_deflate((z_streamp_conflict)((long)pvVar1 + 0xb0),0);
      if (iVar3 == -2) {
        return -0x1e;
      }
      if (*(int *)((long)pvVar1 + 0xd0) == 0) {
        iVar3 = __archive_write_output
                          (a,*(void **)((long)pvVar1 + 0x128),*(size_t *)((long)pvVar1 + 0x120));
        if (iVar3 != 0) goto LAB_00518aa5;
        lVar2 = *(long *)((long)pvVar1 + 0x120);
        *(long *)((long)pvVar1 + 0x18) = *(long *)((long)pvVar1 + 0x18) + lVar2;
        *(long *)((long)pvVar1 + 0x88) = *(long *)((long)pvVar1 + 0x88) + lVar2;
        *(undefined8 *)((long)pvVar1 + 200) = *(undefined8 *)((long)pvVar1 + 0x128);
        *(int *)((long)pvVar1 + 0xd0) = (int)lVar2;
      }
    } while (*(int *)((long)pvVar1 + 0xb8) != 0);
  }
  else {
    if (*(int *)((long)pvVar1 + 0x3c) != 0) {
      archive_set_error(&a->archive,-1,"Invalid ZIP compression type");
      return -0x1e;
    }
    iVar3 = __archive_write_output(a,buff,s);
    if (iVar3 != 0) {
LAB_00518aa5:
      return (long)iVar3;
    }
    *(long *)((long)pvVar1 + 0x88) = *(long *)((long)pvVar1 + 0x88) + s;
    *(long *)((long)pvVar1 + 0x18) = *(long *)((long)pvVar1 + 0x18) + s;
  }
  *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) - s;
  uVar4 = (**(code **)((long)pvVar1 + 0x60))
                    (*(undefined4 *)((long)pvVar1 + 0x38),buff,s & 0xffffffff);
  *(undefined4 *)((long)pvVar1 + 0x38) = uVar4;
  return s;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		ret = __archive_write_output(a, buff, s);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->written_bytes += s;
		zip->entry_compressed_written += s;
		break;
#if HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.avail_out == 0) {
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.next_out = zip->buf;
				zip->stream.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.avail_in != 0);
		break;
#endif

	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	zip->entry_crc32 = zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);

}